

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void CharCallback(GLFWwindow *window,uint codepoint)

{
  if ((long)CORE.Input.Keyboard.charPressedQueueCount < 0x10) {
    CORE.Input.Keyboard.charPressedQueue[CORE.Input.Keyboard.charPressedQueueCount] = codepoint;
    CORE.Input.Keyboard.charPressedQueueCount = CORE.Input.Keyboard.charPressedQueueCount + 1;
  }
  return;
}

Assistant:

static void CharCallback(GLFWwindow *window, unsigned int codepoint)
{
    //TRACELOG(LOG_DEBUG, "Char Callback: Codepoint: %i", codepoint);

    // NOTE: Registers any key down considering OS keyboard layout but
    // does not detect action events, those should be managed by user...
    // Ref: https://github.com/glfw/glfw/issues/668#issuecomment-166794907
    // Ref: https://www.glfw.org/docs/latest/input_guide.html#input_char

    // Check if there is space available in the queue
    if (CORE.Input.Keyboard.charPressedQueueCount < MAX_CHAR_PRESSED_QUEUE)
    {
        // Add character to the queue
        CORE.Input.Keyboard.charPressedQueue[CORE.Input.Keyboard.charPressedQueueCount] = codepoint;
        CORE.Input.Keyboard.charPressedQueueCount++;
    }
}